

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O0

void __thiscall Simulation::handleInputs(Simulation *this)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec<3,_float,_(glm::qualifier)0> local_130 [2];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_110;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_10c;
  vec3 dir;
  float sensitivity;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_f8;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  vec<3,_float,_(glm::qualifier)0> local_e0;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  vec<3,_float,_(glm::qualifier)0> local_c0;
  vec<3,_float,_(glm::qualifier)0> local_b4;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  vec<3,_float,_(glm::qualifier)0> local_94;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_68;
  vec<3,_float,_(glm::qualifier)0> local_58;
  vec<3,_float,_(glm::qualifier)0> local_48;
  vec<3,_float,_(glm::qualifier)0> local_3c;
  vec<3,_float,_(glm::qualifier)0> local_30;
  vec<3,_float,_(glm::qualifier)0> local_1c;
  Simulation *local_10;
  Simulation *this_local;
  
  local_10 = this;
  bVar1 = Input::keyIsDown(0x57);
  if (bVar1) {
    vVar5 = glm::operator*(&(this->_camera).front,(this->_camera).speed);
    local_30._0_8_ = vVar5._0_8_;
    local_1c.field_0 = local_30.field_0;
    local_1c.field_1 = local_30.field_1;
    local_30.field_2 = vVar5.field_2;
    local_1c.field_2 = local_30.field_2;
    local_30 = vVar5;
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_1c);
  }
  bVar1 = Input::keyIsDown(0x41);
  if (bVar1) {
    vVar5 = glm::cross<float,(glm::qualifier)0>(&(this->_camera).front,&(this->_camera).up);
    local_68.field_2 = vVar5.field_2;
    local_58.field_2 = local_68.field_2;
    local_68._0_8_ = vVar5._0_8_;
    local_58.field_0 = local_68.field_0;
    local_58.field_1 = local_68.field_1;
    local_68 = vVar5;
    vVar5 = glm::normalize<3,float,(glm::qualifier)0>(&local_58);
    local_78.field_2 = vVar5.field_2;
    local_48.field_2 = local_78.field_2;
    local_78._0_8_ = vVar5._0_8_;
    local_48.field_0 = local_78.field_0;
    local_48.field_1 = local_78.field_1;
    local_78 = vVar5;
    vVar5 = glm::operator*(&local_48,(this->_camera).speed);
    local_88._0_8_ = vVar5._0_8_;
    local_3c.field_0 = local_88.field_0;
    local_3c.field_1 = local_88.field_1;
    local_88.field_2 = vVar5.field_2;
    local_3c.field_2 = local_88.field_2;
    local_88 = vVar5;
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_3c);
  }
  bVar1 = Input::keyIsDown(0x53);
  if (bVar1) {
    vVar5 = glm::operator*(&(this->_camera).front,(this->_camera).speed);
    local_a8._0_8_ = vVar5._0_8_;
    local_94.field_0 = local_a8.field_0;
    local_94.field_1 = local_a8.field_1;
    local_a8.field_2 = vVar5.field_2;
    local_94.field_2 = local_a8.field_2;
    local_a8 = vVar5;
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_94);
  }
  bVar1 = Input::keyIsDown(0x44);
  if (bVar1) {
    vVar5 = glm::cross<float,(glm::qualifier)0>(&(this->_camera).front,&(this->_camera).up);
    local_e0.field_2 = vVar5.field_2;
    local_d0.field_2 = local_e0.field_2;
    local_e0._0_8_ = vVar5._0_8_;
    local_d0.field_0 = local_e0.field_0;
    local_d0.field_1 = local_e0.field_1;
    vVar5 = glm::normalize<3,float,(glm::qualifier)0>(&local_d0);
    local_f0.field_2 = vVar5.field_2;
    local_c0.field_2 = local_f0.field_2;
    local_f0._0_8_ = vVar5._0_8_;
    local_c0.field_0 = local_f0.field_0;
    local_c0.field_1 = local_f0.field_1;
    vVar5 = glm::operator*(&local_c0,(this->_camera).speed);
    stack0xffffffffffffff00 = vVar5._0_8_;
    local_b4.field_0.x = dir.field_2.z;
    local_b4.field_1.y = sensitivity;
    local_f8 = vVar5.field_2;
    local_b4.field_2 = local_f8;
    unique0x100005ff = vVar5;
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_b4);
  }
  bVar1 = Input::keyIsDown(0x154);
  if (bVar1) {
    (this->_camera).transform.position.field_1.y =
         (this->_camera).speed + (this->_camera).transform.position.field_1.y;
  }
  bVar1 = Input::keyIsDown(0x155);
  if (bVar1) {
    (this->_camera).transform.position.field_1.y =
         (this->_camera).transform.position.field_1.y - (this->_camera).speed;
  }
  dir.field_1.y = 1.0;
  (this->_camera).yaw = Input::mouseOffsetX * 1.0 + (this->_camera).yaw;
  fVar2 = glm::clamp<float>((this->_camera).pitch - Input::mouseOffsetY * 1.0,-89.9,89.9);
  (this->_camera).pitch = fVar2;
  fVar2 = glm::radians<float>((this->_camera).yaw);
  dVar3 = cos((double)fVar2);
  fVar2 = glm::radians<float>((this->_camera).pitch);
  dVar4 = cos((double)fVar2);
  _local_110 = CONCAT44(aStack_10c,(float)(dVar3 * dVar4));
  fVar2 = glm::radians<float>((this->_camera).pitch);
  dVar3 = sin((double)fVar2);
  _local_110 = CONCAT44((float)dVar3,local_110);
  fVar2 = glm::radians<float>((this->_camera).yaw);
  dVar3 = sin((double)fVar2);
  fVar2 = glm::radians<float>((this->_camera).pitch);
  dVar4 = cos((double)fVar2);
  dir.field_0.x = (float)(dVar3 * dVar4);
  vVar5 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&local_110);
  local_130[0]._0_8_ = vVar5._0_8_;
  local_130[0].field_2 = vVar5.field_2;
  local_110 = local_130[0].field_0;
  aStack_10c = local_130[0].field_1;
  dir.field_0.x = local_130[0].field_2.z;
  (this->_camera).front.field_0 = local_130[0].field_0;
  (this->_camera).front.field_1 = local_130[0].field_1;
  (this->_camera).front.field_2 = local_130[0].field_2;
  Input::updateMouseMovements();
  return;
}

Assistant:

void Simulation::handleInputs()
{
    if (Input::keyIsDown(GLFW_KEY_W))
    {
        _camera.transform.position += _camera.front * _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_A))
    {
        _camera.transform.position -=
            glm::normalize(glm::cross(_camera.front, _camera.up)) *
            _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_S))
    {
        _camera.transform.position -= _camera.front * _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_D))
    {
        _camera.transform.position +=
            glm::normalize(glm::cross(_camera.front, _camera.up)) *
            _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_LEFT_SHIFT))
    {
        _camera.transform.position.y += _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_LEFT_CONTROL))
    {
        _camera.transform.position.y -= _camera.speed;
    }

    float sensitivity = 1.0f;
    _camera.yaw += Input::mouseOffsetX*sensitivity;
    _camera.pitch =
        glm::clamp(_camera.pitch - Input::mouseOffsetY*sensitivity,
                -89.9f, 89.9f);

    glm::vec3 dir;
    dir.x = cos(glm::radians(_camera.yaw))*cos(glm::radians(_camera.pitch));
    dir.y = sin(glm::radians(_camera.pitch));
    dir.z = sin(glm::radians(_camera.yaw))*cos(glm::radians(_camera.pitch));
    dir = glm::normalize(dir);
    _camera.front = dir;

    Input::updateMouseMovements();
}